

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryAllocationTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::memory::anon_unknown_0::RandomAllocFreeTestInstance::iterate
          (TestStatus *__return_storage_ptr__,RandomAllocFreeTestInstance *this)

{
  pointer *this_00;
  ulong uVar1;
  bool bVar2;
  deUint32 dVar3;
  VkResult result;
  deBool dVar4;
  VkDevice pVVar5;
  DeviceInterface *pDVar6;
  TestContext *this_01;
  TestLog *this_02;
  MessageBuilder *pMVar7;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  iterator first;
  iterator last;
  deUint64 dVar11;
  InternalError *this_03;
  reference pvVar12;
  TestError *this_04;
  reference pvVar13;
  void *pvVar14;
  bool bVar15;
  bool bVar16;
  VkDeviceSize *local_5b0;
  VkDeviceSize *local_580;
  ulong local_538;
  VkDeviceSize local_4c0;
  Handle<(vk::HandleType)7> local_4a0;
  deUint64 local_498;
  byte local_489;
  reference pvStack_488;
  bool isDeviceLocal_2;
  MemoryObject *memoryObject;
  size_t memoryObjectNdx;
  Heap *heap_1;
  size_t heapNdx_2;
  size_t nonEmptyHeapNdx;
  VkMemoryAllocateInfo alloc;
  MemoryObject object;
  VkDeviceSize allocationSize;
  VkDeviceSize maxAllocSize;
  bool isDeviceLocal_1;
  MemoryType local_3f4;
  MemoryType *local_3e8;
  MemoryType *memoryType;
  Heap *heap;
  size_t heapNdx_1;
  size_t nonFullHeapNdx;
  string local_3c0;
  undefined1 local_39b;
  byte local_39a;
  byte local_399;
  bool isHeapEmpty;
  bool isHeapFull;
  ulong uStack_398;
  bool isDeviceLocal;
  size_t heapNdx;
  MessageBuilder local_200;
  bool local_79;
  undefined1 local_78 [7];
  bool allocateMore;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nonEmptyHeaps;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nonFullHeaps;
  bool canAllocateDev;
  bool canAllocateSys;
  VkDeviceSize usedSysMem;
  bool isUMA;
  TestLog *log;
  DeviceInterface *vkd;
  VkDevice device;
  RandomAllocFreeTestInstance *this_local;
  
  pVVar5 = vkt::Context::getDevice((this->super_TestInstance).m_context);
  pDVar6 = vkt::Context::getDeviceInterface((this->super_TestInstance).m_context);
  this_01 = vkt::Context::getTestContext((this->super_TestInstance).m_context);
  this_02 = tcu::TestContext::getLog(this_01);
  bVar16 = (this->m_memoryLimits).totalDeviceLocalMemory == 0;
  if (bVar16) {
    local_4c0 = this->m_totalDeviceMem + this->m_totalSystemMem;
  }
  else {
    local_4c0 = this->m_totalSystemMem;
  }
  bVar15 = local_4c0 + this->m_allocSysMemSize + 0x400 < (this->m_memoryLimits).totalSystemMemory;
  bVar2 = bVar15;
  if (!bVar16) {
    bVar2 = this->m_totalDeviceMem + 0x10 < (this->m_memoryLimits).totalDeviceLocalMemory;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &nonEmptyHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
  if (this->m_opNdx == 0) {
    tcu::TestLog::operator<<(&local_200,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_200,(char (*) [12])"Performing ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_opCount);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [74])
                               " random VkAllocMemory() / VkFreeMemory() calls before freeing all memory."
                       );
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_200);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&heapNdx,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&heapNdx,
                        (char (*) [49])"Using max 1/8 of the memory in each memory heap.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&heapNdx);
  }
  for (uStack_398 = 0; uVar1 = uStack_398,
      sVar8 = std::
              vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
              ::size(&this->m_heaps), uVar1 < sVar8; uStack_398 = uStack_398 + 1) {
    pvVar9 = std::
             vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
             ::operator[](&this->m_heaps,uStack_398);
    local_399 = ((pvVar9->heap).flags & 1) != 0;
    pvVar9 = std::
             vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
             ::operator[](&this->m_heaps,uStack_398);
    uVar1 = pvVar9->memoryUsage;
    pvVar9 = std::
             vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
             ::operator[](&this->m_heaps,uStack_398);
    local_39a = pvVar9->maxMemoryUsage <= uVar1;
    pvVar9 = std::
             vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
             ::operator[](&this->m_heaps,uStack_398);
    local_39b = pvVar9->memoryUsage == 0;
    if (!(bool)local_39b) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,
                 &stack0xfffffffffffffc68);
    }
    if (((local_39a & 1) == 0) &&
       ((((bVar16 && (bVar15)) || ((!bVar16 && (((local_399 & 1) != 0 && (bVar2)))))) ||
        ((!bVar16 && (((local_399 & 1) == 0 && (bVar15)))))))) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &nonEmptyHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&stack0xfffffffffffffc68);
    }
  }
  if (this->m_opNdx < this->m_opCount) {
    bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
    if ((((bVar2) ||
         (bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &nonEmptyHeaps.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage), bVar2)) ||
        (3999 < this->m_memoryObjectCount)) || (!bVar15)) {
      bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
      if (bVar2) {
        local_79 = true;
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &nonEmptyHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_79 = false;
      }
    }
    else {
      local_79 = de::Random::getBool(&this->m_rng);
    }
  }
  else {
    bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c0,"Pass",(allocator<char> *)((long)&nonFullHeapNdx + 7));
      tcu::TestStatus::pass(__return_storage_ptr__,&local_3c0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&nonFullHeapNdx + 7));
      goto LAB_00bad928;
    }
    local_79 = false;
  }
  if (local_79 == false) {
    dVar3 = de::Random::getUint32(&this->m_rng);
    sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
    heapNdx_2 = (ulong)dVar3 % (sVar8 & 0xffffffff);
    pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,heapNdx_2
                        );
    heap_1 = (Heap *)*pvVar10;
    memoryObjectNdx =
         (size_t)std::
                 vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
                 ::operator[](&this->m_heaps,(size_type)heap_1);
    dVar3 = de::Random::getUint32(&this->m_rng);
    sVar8 = std::
            vector<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
            ::size((vector<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                    *)(memoryObjectNdx + 0x38));
    memoryObject = (MemoryObject *)((ulong)dVar3 % sVar8);
    pvStack_488 = std::
                  vector<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                  ::operator[]((vector<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                                *)(memoryObjectNdx + 0x38),(size_type)memoryObject);
    local_489 = *(byte *)(memoryObjectNdx + 8) & 1;
    local_498 = (pvStack_488->memory).m_internal;
    (*pDVar6->_vptr_DeviceInterface[6])(pDVar6,pVVar5,local_498,0);
    ::vk::Handle<(vk::HandleType)7>::Handle(&local_4a0,0);
    (pvStack_488->memory).m_internal = local_4a0.m_internal;
    this->m_memoryObjectCount = this->m_memoryObjectCount - 1;
    *(VkDeviceSize *)(memoryObjectNdx + 0x10) =
         *(long *)(memoryObjectNdx + 0x10) - pvStack_488->size;
    if ((local_489 & 1) == 0) {
      local_5b0 = &this->m_totalSystemMem;
    }
    else {
      local_5b0 = &this->m_totalDeviceMem;
    }
    *local_5b0 = *local_5b0 - pvStack_488->size;
    this->m_totalSystemMem = this->m_totalSystemMem - this->m_allocSysMemSize;
    pvVar12 = std::
              vector<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
              ::back((vector<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                      *)(memoryObjectNdx + 0x38));
    pvVar13 = std::
              vector<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
              ::operator[]((vector<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                            *)(memoryObjectNdx + 0x38),(size_type)memoryObject);
    (pvVar13->memory).m_internal = (pvVar12->memory).m_internal;
    pvVar13->size = pvVar12->size;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
    ::pop_back((vector<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                *)(memoryObjectNdx + 0x38));
  }
  else {
    dVar3 = de::Random::getUint32(&this->m_rng);
    this_00 = &nonEmptyHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
    heapNdx_1 = (ulong)dVar3 % (sVar8 & 0xffffffff);
    pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,heapNdx_1)
    ;
    heap = (Heap *)*pvVar10;
    memoryType = (MemoryType *)
                 std::
                 vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
                 ::operator[](&this->m_heaps,(size_type)heap);
    first = std::
            vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
            ::begin(&((reference)memoryType)->types);
    last = std::
           vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
           ::end((vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
                  *)&memoryType[2].type.heapIndex);
    local_3f4 = de::Random::
                choose<vkt::memory::(anonymous_namespace)::MemoryType,__gnu_cxx::__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryType*,std::vector<vkt::memory::(anonymous_namespace)::MemoryType,std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>>>>
                          (&this->m_rng,
                           (__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryType_*,_std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>_>
                            )first._M_current,
                           (__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryType_*,_std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>_>
                            )last._M_current);
    local_3e8 = &local_3f4;
    bVar2 = ((memoryType->type).heapIndex & 1) == 0;
    if ((bVar2) || (bVar16)) {
      local_538 = de::min<unsigned_long>
                            (*(long *)(memoryType + 2) - (long)memoryType[1].type,
                             ((this->m_memoryLimits).totalSystemMemory - local_4c0) -
                             this->m_allocSysMemSize);
    }
    else {
      local_538 = de::min<unsigned_long>
                            (*(long *)(memoryType + 2) - (long)memoryType[1].type,
                             (this->m_memoryLimits).totalDeviceLocalMemory - this->m_totalDeviceMem)
      ;
    }
    dVar11 = de::Random::getUint64(&this->m_rng);
    pvVar14 = (void *)(dVar11 % local_538 + 1);
    if (((void *)(*(long *)(memoryType + 2) - (long)memoryType[1].type) < pvVar14) &&
       (pvVar14 != (void *)0x1)) {
      this_03 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this_03,"Test Error: trying to allocate memory more than the available heap size.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                 ,0x1bd);
      __cxa_throw(this_03,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    ::vk::Handle<(vk::HandleType)7>::Handle((Handle<(vk::HandleType)7> *)&alloc.memoryTypeIndex,0);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
    ::push_back((vector<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                 *)&memoryType[4].type.heapIndex,(value_type *)&alloc.memoryTypeIndex);
    nonEmptyHeapNdx._0_4_ = 5;
    alloc.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    alloc._4_4_ = 0;
    alloc.allocationSize._0_4_ = local_3e8->index;
    alloc.pNext = pvVar14;
    pvVar12 = std::
              vector<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
              ::back((vector<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                      *)&memoryType[4].type.heapIndex);
    result = (*pDVar6->_vptr_DeviceInterface[5])(pDVar6,pVVar5,&nonEmptyHeapNdx,0,pvVar12);
    ::vk::checkResult(result,
                      "vkd.allocateMemory(device, &alloc, (const VkAllocationCallbacks*)DE_NULL, &heap.objects.back().memory)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                      ,0x1cf);
    do {
      dVar4 = ::deGetFalse();
      if (dVar4 != 0) {
LAB_00bad593:
        this_04 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_04,(char *)0x0,"!!heap.objects.back().memory",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                   ,0x1d0);
        __cxa_throw(this_04,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      pvVar12 = std::
                vector<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                ::back((vector<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                        *)&memoryType[4].type.heapIndex);
      bVar16 = ::vk::Handle<(vk::HandleType)7>::operator!(&pvVar12->memory);
      if (bVar16) goto LAB_00bad593;
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    this->m_memoryObjectCount = this->m_memoryObjectCount + 1;
    memoryType[1].type = (VkMemoryType)((long)pvVar14 + (long)memoryType[1].type);
    if (bVar2) {
      local_580 = &this->m_totalSystemMem;
    }
    else {
      local_580 = &this->m_totalDeviceMem;
    }
    *local_580 = (long)pvVar14 + *local_580;
    this->m_totalSystemMem = this->m_allocSysMemSize + this->m_totalSystemMem;
  }
  this->m_opNdx = this->m_opNdx + 1;
  tcu::TestStatus::incomplete();
LAB_00bad928:
  nonFullHeapNdx._0_4_ = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &nonEmptyHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus RandomAllocFreeTestInstance::iterate (void)
{
	const VkDevice			device			= m_context.getDevice();
	const DeviceInterface&	vkd				= m_context.getDeviceInterface();
	TestLog&				log				= m_context.getTestContext().getLog();
	const bool				isUMA			= m_memoryLimits.totalDeviceLocalMemory == 0;
	const VkDeviceSize		usedSysMem		= isUMA ? (m_totalDeviceMem+m_totalSystemMem) : m_totalSystemMem;
	const bool				canAllocateSys	= usedSysMem + m_allocSysMemSize + 1024 < m_memoryLimits.totalSystemMemory; // \note Always leave room for 1 KiB sys mem alloc
	const bool				canAllocateDev	= isUMA ? canAllocateSys : (m_totalDeviceMem + 16 < m_memoryLimits.totalDeviceLocalMemory);
	vector<size_t>			nonFullHeaps;
	vector<size_t>			nonEmptyHeaps;
	bool					allocateMore;

	if (m_opNdx == 0)
	{
		log << TestLog::Message << "Performing " << m_opCount << " random VkAllocMemory() / VkFreeMemory() calls before freeing all memory." << TestLog::EndMessage;
		log << TestLog::Message << "Using max 1/8 of the memory in each memory heap." << TestLog::EndMessage;
	}

	// Sort heaps based on whether allocations or frees are possible
	for (size_t heapNdx = 0; heapNdx < m_heaps.size(); ++heapNdx)
	{
		const bool	isDeviceLocal	= (m_heaps[heapNdx].heap.flags & VK_MEMORY_HEAP_DEVICE_LOCAL_BIT) != 0;
		const bool	isHeapFull		= m_heaps[heapNdx].memoryUsage >= m_heaps[heapNdx].maxMemoryUsage;
		const bool	isHeapEmpty		= m_heaps[heapNdx].memoryUsage == 0;

		if (!isHeapEmpty)
			nonEmptyHeaps.push_back(heapNdx);

		if (!isHeapFull && ((isUMA && canAllocateSys) ||
							(!isUMA && isDeviceLocal && canAllocateDev) ||
							(!isUMA && !isDeviceLocal && canAllocateSys)))
			nonFullHeaps.push_back(heapNdx);
	}

	if (m_opNdx >= m_opCount)
	{
		if (nonEmptyHeaps.empty())
			return tcu::TestStatus::pass("Pass");
		else
			allocateMore = false;
	}
	else if (!nonEmptyHeaps.empty() &&
			 !nonFullHeaps.empty() &&
			 (m_memoryObjectCount < MAX_ALLOCATION_COUNT) &&
			 canAllocateSys)
		allocateMore = m_rng.getBool(); // Randomize if both operations are doable.
	else if (nonEmptyHeaps.empty())
	{
		DE_ASSERT(canAllocateSys);
		allocateMore = true; // Allocate more if there are no objects to free.
	}
	else if (nonFullHeaps.empty() || !canAllocateSys)
		allocateMore = false; // Free objects if there is no free space for new objects.
	else
	{
		allocateMore = false;
		DE_FATAL("Fail");
	}

	if (allocateMore)
	{
		const size_t		nonFullHeapNdx	= (size_t)(m_rng.getUint32() % (deUint32)nonFullHeaps.size());
		const size_t		heapNdx			= nonFullHeaps[nonFullHeapNdx];
		Heap&				heap			= m_heaps[heapNdx];
		const MemoryType&	memoryType		= m_rng.choose<MemoryType>(heap.types.begin(), heap.types.end());
		const bool			isDeviceLocal	= (heap.heap.flags & VK_MEMORY_HEAP_DEVICE_LOCAL_BIT) != 0;
		const VkDeviceSize	maxAllocSize	= (isDeviceLocal && !isUMA)
											? de::min(heap.maxMemoryUsage - heap.memoryUsage, (VkDeviceSize)m_memoryLimits.totalDeviceLocalMemory - m_totalDeviceMem)
											: de::min(heap.maxMemoryUsage - heap.memoryUsage, (VkDeviceSize)m_memoryLimits.totalSystemMemory - usedSysMem - m_allocSysMemSize);
		const VkDeviceSize	allocationSize	= 1 + (m_rng.getUint64() % maxAllocSize);

		if ((allocationSize > (deUint64)(heap.maxMemoryUsage - heap.memoryUsage)) && (allocationSize != 1))
			TCU_THROW(InternalError, "Test Error: trying to allocate memory more than the available heap size.");

		const MemoryObject object =
		{
			(VkDeviceMemory)0,
			allocationSize
		};

		heap.objects.push_back(object);

		const VkMemoryAllocateInfo alloc =
		{
			VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,	// sType
			DE_NULL,								// pNext
			object.size,							// allocationSize
			memoryType.index						// memoryTypeIndex;
		};

		VK_CHECK(vkd.allocateMemory(device, &alloc, (const VkAllocationCallbacks*)DE_NULL, &heap.objects.back().memory));
		TCU_CHECK(!!heap.objects.back().memory);
		m_memoryObjectCount++;

		heap.memoryUsage										+= allocationSize;
		(isDeviceLocal ? m_totalDeviceMem : m_totalSystemMem)	+= allocationSize;
		m_totalSystemMem										+= m_allocSysMemSize;
	}
	else
	{
		const size_t		nonEmptyHeapNdx	= (size_t)(m_rng.getUint32() % (deUint32)nonEmptyHeaps.size());
		const size_t		heapNdx			= nonEmptyHeaps[nonEmptyHeapNdx];
		Heap&				heap			= m_heaps[heapNdx];
		const size_t		memoryObjectNdx	= m_rng.getUint32() % heap.objects.size();
		MemoryObject&		memoryObject	= heap.objects[memoryObjectNdx];
		const bool			isDeviceLocal	= (heap.heap.flags & VK_MEMORY_HEAP_DEVICE_LOCAL_BIT) != 0;

		vkd.freeMemory(device, memoryObject.memory, (const VkAllocationCallbacks*)DE_NULL);
		memoryObject.memory = (VkDeviceMemory)0;
		m_memoryObjectCount--;

		heap.memoryUsage										-= memoryObject.size;
		(isDeviceLocal ? m_totalDeviceMem : m_totalSystemMem)	-= memoryObject.size;
		m_totalSystemMem										-= m_allocSysMemSize;

		heap.objects[memoryObjectNdx] = heap.objects.back();
		heap.objects.pop_back();

		DE_ASSERT(heap.memoryUsage == 0 || !heap.objects.empty());
	}

	m_opNdx++;
	return tcu::TestStatus::incomplete();
}